

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void __thiscall common_log::~common_log(common_log *this)

{
  pause(this);
  if ((FILE *)this->file != (FILE *)0x0) {
    fclose((FILE *)this->file);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->cur).msg.super__Vector_base<char,_std::allocator<char>_>);
  std::vector<common_log_entry,_std::allocator<common_log_entry>_>::~vector(&this->entries);
  std::condition_variable::~condition_variable(&this->cv);
  std::thread::~thread(&this->thrd);
  return;
}

Assistant:

~common_log() {
        pause();
        if (file) {
            fclose(file);
        }
    }